

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_packet.cc
# Opt level: O0

void __thiscall QuickPacket::QuickPacket(QuickPacket *this,QuickPacket *other)

{
  pointer puVar1;
  pointer __src;
  QuickPacket *other_local;
  QuickPacket *this_local;
  
  this->_sequence_number = 0;
  this->_packet_number = 0;
  std::unique_ptr<unsigned_char,std::default_delete<unsigned_char>>::
  unique_ptr<std::default_delete<unsigned_char>,void>
            ((unique_ptr<unsigned_char,std::default_delete<unsigned_char>> *)&this->_data);
  this->_data_len = 0;
  this->_acked = false;
  puVar1 = (pointer)operator_new__(0x578);
  std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::reset(&this->_data,puVar1);
  this->_data_len = other->_data_len;
  puVar1 = std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::get(&this->_data);
  __src = std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::get(&other->_data);
  memcpy(puVar1,__src,(ulong)this->_data_len);
  this->_pkt_sent_time = other->_pkt_sent_time;
  this->_sequence_number = other->_sequence_number;
  return;
}

Assistant:

QuickPacket::QuickPacket(const QuickPacket* other)
{
	_data.reset(new uint8_t[MAX_PKT_LEN]);
	_data_len = other->_data_len;
	memcpy(_data.get(), other->_data.get(), _data_len);
	_pkt_sent_time = other->_pkt_sent_time;
	_sequence_number = other->_sequence_number;
}